

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

void __thiscall pbrt::GammaColorEncoding::GammaColorEncoding(GammaColorEncoding *this,Float gamma)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int i_1;
  int i;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 extraout_var [60];
  
  this->gamma = gamma;
  lVar4 = 0;
  memset(&this->applyLUT,0,0x1400);
  do {
    fVar5 = powf((float)(int)lVar4 / 255.0,gamma);
    (this->applyLUT).values[lVar4] = fVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  lVar4 = 0;
  do {
    auVar6._0_4_ = powf((float)(int)lVar4 / 1023.0,1.0 / gamma);
    auVar6._4_60_ = extraout_var;
    auVar3 = vfmadd213ss_fma(auVar6._0_16_,SUB6416(ZEXT464(0x437f0000),0),ZEXT416(0x3f000000));
    auVar1 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar3);
    uVar2 = vcmpss_avx512f(auVar3,ZEXT816(0) << 0x40,1);
    (this->inverseLUT).values[lVar4] = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar1._0_4_);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x400);
  return;
}

Assistant:

GammaColorEncoding::GammaColorEncoding(Float gamma) : gamma(gamma) {
    for (int i = 0; i < 256; ++i) {
        Float v = Float(i) / 255.f;
        applyLUT[i] = std::pow(v, gamma);
    }
    for (int i = 0; i < int(inverseLUT.size()); ++i) {
        Float v = Float(i) / Float(inverseLUT.size() - 1);
        inverseLUT[i] = Clamp(255.f * std::pow(v, 1.f / gamma) + .5f, 0, 255);
    }
}